

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::TrySetFrameObjectInHeapArgObj
          (InterpreterStackFrame *this,ScriptContext *scriptContext,bool hasNonSimpleParams,
          bool isScopeObjRestored)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  uint uVar4;
  ActivationObject *pAVar5;
  FunctionBody *this_00;
  ScriptFunction *varFunc;
  ScriptContext *scriptContext_00;
  undefined4 *puVar6;
  undefined8 uVar7;
  JavascriptFunction *funcCallee;
  ActivationObject *local_90;
  nullptr_t local_60;
  WriteBarrierPtr<Js::DynamicType> local_58;
  Type literalType;
  HeapArgumentsObject *pHStack_48;
  bool isCachedScope;
  HeapArgumentsObject *heapArgObj;
  PropertyIdArray *propIds;
  ActivationObject *pAStack_30;
  uint32 formalsCount;
  Var frameObject;
  bool isScopeObjRestored_local;
  bool hasNonSimpleParams_local;
  ScriptContext *scriptContext_local;
  InterpreterStackFrame *this_local;
  
  AVar3 = ParseableFunctionInfo::GetInParamsCount(*(ParseableFunctionInfo **)(this + 0x88));
  propIds._4_4_ = AVar3 - 1;
  heapArgObj = (HeapArgumentsObject *)0x0;
  pHStack_48 = (HeapArgumentsObject *)0x0;
  if ((*(long *)(this + 0x40) != 0) &&
     (pAVar5 = HeapArgumentsObject::GetFrameObject(*(HeapArgumentsObject **)(this + 0x40)),
     pAVar5 == (ActivationObject *)0x0)) {
    pHStack_48 = *(HeapArgumentsObject **)(this + 0x40);
  }
  literalType.ptr._7_1_ = 0;
  bVar2 = FunctionBody::NeedScopeObjectForArguments
                    (*(FunctionBody **)(this + 0x88),hasNonSimpleParams);
  if (bVar2) {
    pAStack_30 = (ActivationObject *)GetLocalClosure(this);
    literalType.ptr._7_1_ = FunctionBody::HasCachedScopePropIds(*(FunctionBody **)(this + 0x88));
    heapArgObj = (HeapArgumentsObject *)
                 FunctionBody::GetFormalsPropIdArray(*(FunctionBody **)(this + 0x88),true);
    if ((isScopeObjRestored) && (bVar2 = VarIs<Js::ActivationObject>(pAStack_30), bVar2)) {
      this_00 = GetFunctionBody(this);
      bVar2 = ParseableFunctionInfo::GetDoScopeObjectCreation(&this_00->super_ParseableFunctionInfo)
      ;
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x2516,"(this->GetFunctionBody()->GetDoScopeObjectCreation())",
                                    "this->GetFunctionBody()->GetDoScopeObjectCreation()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      literalType.ptr._7_1_ = 1;
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StackArgFormalsOptPhase);
      if (((bVar2) && ((DAT_01ec73ca & 1) != 0)) &&
         (AVar3 = ParseableFunctionInfo::GetInParamsCount(*(ParseableFunctionInfo **)(this + 0x88)),
         1 < AVar3)) {
        uVar7 = (**(code **)(**(long **)(this + 0x88) + 0x38))();
        uVar4 = FunctionProxy::GetFunctionNumber(*(FunctionProxy **)(this + 0x88));
        Output::Print(L"StackArgFormals : %s (%d) :Using the restored scope object in the bail out path. \n"
                      ,uVar7,(ulong)uVar4);
        Output::Flush();
      }
    }
    else {
      if ((literalType.ptr._7_1_ & 1) == 0) {
        scriptContext_00 = GetScriptContext(this);
        pAStack_30 = (ActivationObject *)
                     Js::JavascriptOperators::OP_NewScopeObject(scriptContext_00);
      }
      else {
        local_60 = (nullptr_t)0x0;
        Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&local_58,&local_60);
        if ((((ulong)(heapArgObj->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
                     super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject & 0x100000000000000) != 0) || (hasNonSimpleParams)
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0x2523,
                                      "(!propIds->hasNonSimpleParams && !hasNonSimpleParams)",
                                      "!propIds->hasNonSimpleParams && !hasNonSimpleParams");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        varFunc = GetJavascriptFunction(this);
        pAStack_30 = (ActivationObject *)
                     Js::JavascriptOperators::OP_InitCachedScope
                               (varFunc,(PropertyIdArray *)heapArgObj,&local_58,hasNonSimpleParams,
                                scriptContext);
      }
      if (heapArgObj == (HeapArgumentsObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x252a,"(propIds != nullptr)","propIds != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      SetLocalClosure(this,pAStack_30);
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StackArgFormalsOptPhase);
      if (((bVar2) && ((DAT_01ec73ca & 1) != 0)) &&
         (AVar3 = ParseableFunctionInfo::GetInParamsCount(*(ParseableFunctionInfo **)(this + 0x88)),
         1 < AVar3)) {
        uVar7 = (**(code **)(**(long **)(this + 0x88) + 0x38))();
        uVar4 = FunctionProxy::GetFunctionNumber(*(FunctionProxy **)(this + 0x88));
        Output::Print(L"StackArgFormals : %s (%d) :Creating scope object in the bail out path. \n",
                      uVar7,(ulong)uVar4);
        Output::Flush();
      }
    }
  }
  else {
    if (((propIds._4_4_ != 0) &&
        (bVar2 = ParseableFunctionInfo::GetIsStrictMode(*(ParseableFunctionInfo **)(this + 0x88)),
        !bVar2)) && (!hasNonSimpleParams)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x2537,
                                  "(formalsCount == 0 || (m_functionBody->GetIsStrictMode() || hasNonSimpleParams))"
                                  ,
                                  "formalsCount == 0 || (m_functionBody->GetIsStrictMode() || hasNonSimpleParams)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pAStack_30 = (ActivationObject *)0x0;
    propIds._4_4_ = 0;
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StackArgOptPhase);
    if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
      uVar7 = (**(code **)(**(long **)(this + 0x88) + 0x38))();
      uVar4 = FunctionProxy::GetFunctionNumber(*(FunctionProxy **)(this + 0x88));
      Output::Print(L"StackArgOpt : %s (%d) :Creating NULL scope object in the bail out path. \n",
                    uVar7,(ulong)uVar4);
      Output::Flush();
    }
  }
  if (pHStack_48 != (HeapArgumentsObject *)0x0) {
    if ((pAStack_30 != (ActivationObject *)0x0) &&
       (bVar2 = VarIs<Js::ActivationObject>(pAStack_30), !bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x2544,
                                  "(frameObject == nullptr || VarIs<ActivationObject>(frameObject))"
                                  ,"frameObject == nullptr || VarIs<ActivationObject>(frameObject)")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    HeapArgumentsObject::SetFormalCount(pHStack_48,propIds._4_4_);
    if (pAStack_30 == (ActivationObject *)0x0) {
      local_90 = (ActivationObject *)0x0;
    }
    else {
      local_90 = pAStack_30;
    }
    HeapArgumentsObject::SetFrameObject(pHStack_48,local_90);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StackArgFormalsOptPhase);
    if ((bVar2) && (propIds._4_4_ != 0)) {
      uVar7 = (**(code **)(**(long **)(this + 0x88) + 0x38))();
      uVar4 = FunctionProxy::GetFunctionNumber(*(FunctionProxy **)(this + 0x88));
      Output::Print(L"StackArgFormals : %s (%d) :Attaching the scope object with the heap arguments object in the bail out path. \n"
                    ,uVar7,(ulong)uVar4);
      Output::Flush();
    }
  }
  funcCallee = (JavascriptFunction *)(**(code **)(**(long **)(this + 0x80) + 0x3d0))();
  Js::JavascriptOperators::FillScopeObject
            (funcCallee,*(int *)(this + 0x18) - 1,propIds._4_4_,pAStack_30,
             (Var *)(*(long *)(this + 0x20) + 8),(PropertyIdArray *)heapArgObj,pHStack_48,
             scriptContext,hasNonSimpleParams,(bool)(literalType.ptr._7_1_ & 1));
  return;
}

Assistant:

void InterpreterStackFrame::TrySetFrameObjectInHeapArgObj(ScriptContext * scriptContext, bool hasNonSimpleParams, bool isScopeObjRestored)
    {
        Var frameObject = nullptr;

        uint32 formalsCount = this->m_functionBody->GetInParamsCount() - 1;
        Js::PropertyIdArray * propIds = nullptr;
        Js::HeapArgumentsObject* heapArgObj = nullptr;

        //We always set the Frame object to nullptr in BailOutRecord::EnsureArguments for stack args optimization.
        if (m_arguments != nullptr && ((Js::HeapArgumentsObject*)(m_arguments))->GetFrameObject() == nullptr)
        {
            heapArgObj = (Js::HeapArgumentsObject*)m_arguments;
        }

        bool isCachedScope = false;

        //For Non-simple params, we don't have a scope object created.
        if (this->m_functionBody->NeedScopeObjectForArguments(hasNonSimpleParams))
        {
            frameObject = GetLocalClosure();

            isCachedScope = m_functionBody->HasCachedScopePropIds();
            propIds = this->m_functionBody->GetFormalsPropIdArray();

            if (isScopeObjRestored && VarIs<ActivationObject>(frameObject))
            {
                Assert(this->GetFunctionBody()->GetDoScopeObjectCreation());
                isCachedScope = true;
                if (PHASE_VERBOSE_TRACE1(Js::StackArgFormalsOptPhase) && m_functionBody->GetInParamsCount() > 1)
                {
                    Output::Print(_u("StackArgFormals : %s (%d) :Using the restored scope object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                    Output::Flush();
                }
            }
            else
            {
                if (isCachedScope)
                {
                    Field(DynamicType*) literalType = nullptr;
                    Assert(!propIds->hasNonSimpleParams && !hasNonSimpleParams);
                    frameObject = JavascriptOperators::OP_InitCachedScope(this->GetJavascriptFunction(), propIds, &literalType, hasNonSimpleParams, scriptContext);
                }
                else
                {
                    frameObject = JavascriptOperators::OP_NewScopeObject(GetScriptContext());
                }
                Assert(propIds != nullptr);
                SetLocalClosure(frameObject);

                if (PHASE_VERBOSE_TRACE1(Js::StackArgFormalsOptPhase) && m_functionBody->GetInParamsCount() > 1)
                {
                    Output::Print(_u("StackArgFormals : %s (%d) :Creating scope object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                    Output::Flush();
                }
            }
        }
        else
        {
            //We reached here because, either we don't have any formals or we don't have a scope object (it could be in strict mode or have non-simple param list)
            Assert(formalsCount == 0 || (m_functionBody->GetIsStrictMode() || hasNonSimpleParams));
            frameObject = nullptr;
            formalsCount = 0;

            if (PHASE_VERBOSE_TRACE1(Js::StackArgOptPhase))
            {
                Output::Print(_u("StackArgOpt : %s (%d) :Creating NULL scope object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                Output::Flush();
            }
        }

        if (heapArgObj)
        {
            Assert(frameObject == nullptr || VarIs<ActivationObject>(frameObject));
            heapArgObj->SetFormalCount(formalsCount);
            heapArgObj->SetFrameObject(frameObject != nullptr ?
                static_cast<ActivationObject*>(frameObject) : nullptr);

            if (PHASE_TRACE1(Js::StackArgFormalsOptPhase) && formalsCount > 0)
            {
                Output::Print(_u("StackArgFormals : %s (%d) :Attaching the scope object with the heap arguments object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                Output::Flush();
            }
        }

        //Fill the Heap arguments and scope object with values
        // If there is no heap arguments object, then fill only the scope object with actuals.
        JavascriptOperators::FillScopeObject(this->function->GetRealFunctionObject(), this->m_inSlotsCount - 1, formalsCount, frameObject, &this->m_inParams[1], propIds, heapArgObj, scriptContext, hasNonSimpleParams, isCachedScope);
    }